

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O2

int __thiscall ON_ClippingRegion::InClipPlaneRegion(ON_ClippingRegion *this,ON_BoundingBox *bbox)

{
  bool bVar1;
  int iVar2;
  ON_3dPoint local_d8;
  double local_c0;
  double dStack_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double dStack_68;
  double local_60;
  double local_58;
  double dStack_50;
  double local_48;
  double local_40;
  double dStack_38;
  double local_30;
  double local_28;
  double dStack_20;
  
  bVar1 = ON_IsValid((bbox->m_min).x);
  iVar2 = 0;
  if (bVar1) {
    bVar1 = ON_IsValid((bbox->m_max).x);
    if (bVar1) {
      local_a8 = (bbox->m_min).x;
      local_60 = (bbox->m_max).x;
      iVar2 = 0;
      if (local_a8 <= local_60) {
        if (this->m_clip_plane_count < 1) {
          iVar2 = 2;
        }
        else {
          local_d8.z = (bbox->m_min).z;
          local_d8.x = (bbox->m_min).x;
          local_d8.y = (bbox->m_min).y;
          local_c0 = (bbox->m_max).x;
          dStack_b8 = (bbox->m_max).y;
          local_b0 = (bbox->m_max).z;
          local_88 = (bbox->m_max).y;
          local_98 = (bbox->m_max).z;
          local_a0 = (bbox->m_min).y;
          local_80 = (bbox->m_min).z;
          local_90 = local_a8;
          local_78 = local_a8;
          local_70 = local_88;
          dStack_68 = local_98;
          local_58 = local_a0;
          dStack_50 = local_80;
          local_48 = local_60;
          local_40 = local_a0;
          dStack_38 = local_98;
          local_30 = local_60;
          local_28 = local_88;
          dStack_20 = local_80;
          iVar2 = InClipPlaneRegion(this,8,&local_d8);
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int ON_ClippingRegion::InClipPlaneRegion( 
  const ON_BoundingBox& bbox
  ) const
{
  if (    !ON_IsValid(bbox.m_min.x) 
       || !ON_IsValid(bbox.m_max.x) 
       || bbox.m_min.x > bbox.m_max.x
       )
  {
    return 0;
  }

  if ( m_clip_plane_count <= 0 )
  {
    return 2;
  }

  ON_3dPoint P[8];
  P[0] = bbox.m_min;
  P[1] = bbox.m_max;
  P[2].x = bbox.m_min.x; P[2].y = bbox.m_min.y; P[2].z = bbox.m_max.z;
  P[3].x = bbox.m_min.x; P[3].y = bbox.m_max.y; P[3].z = bbox.m_min.z;
  P[4].x = bbox.m_min.x; P[4].y = bbox.m_max.y; P[4].z = bbox.m_max.z;
  P[5].x = bbox.m_max.x; P[5].y = bbox.m_min.y; P[5].z = bbox.m_min.z;
  P[6].x = bbox.m_max.x; P[6].y = bbox.m_min.y; P[6].z = bbox.m_max.z;
  P[7].x = bbox.m_max.x; P[7].y = bbox.m_max.y; P[7].z = bbox.m_min.z;

  return InClipPlaneRegion(8,P);
}